

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strong_typedef.cpp
# Opt level: O3

void use_handle(handle h)

{
  ostream *poVar1;
  int a;
  char local_1f [7];
  
  poVar1 = (ostream *)
           std::ostream::operator<<
                     ((ostream *)&std::cout,*(int *)h.super_strong_typedef<handle,_int_*>.value_);
  local_1f[0] = '\n';
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_1f,1);
  poVar1 = std::ostream::_M_insert<void_const*>(&std::cout);
  local_1f[1] = 0x20;
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_1f + 1,1);
  poVar1 = std::ostream::_M_insert<void_const*>(poVar1);
  local_1f[2] = 10;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_1f + 2,1);
  return;
}

Assistant:

void use_handle(handle h)
{
    // we can dereference it
    std::cout << *h << '\n';

    // and compare it
    (void)(h == handle(nullptr));

    // and reassign
    int a;
    h = handle(&a);
    // or get back
    int* ptr = static_cast<int*>(h);
    std::cout << &a << ' ' << ptr << '\n';
}